

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O2

int VP8GetCostUV(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *pVVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int16_t (*paiVar7) [16];
  int16_t (*paiVar8) [16];
  long lVar9;
  VP8Residual res;
  int local_a4;
  int16_t (*local_a0) [16];
  int *local_98;
  VP8Residual local_60;
  
  pVVar2 = it->enc_;
  VP8IteratorNzToBytes(it);
  local_60.coeff_type = 2;
  local_60.prob = (pVVar2->proba_).coeffs_[2];
  local_60.stats = (pVVar2->proba_).stats_[2];
  local_60.costs = (pVVar2->proba_).remapped_costs_[2];
  local_60.first = 0;
  local_a0 = rd->uv_levels;
  local_98 = it->top_nz_ + 4;
  local_a4 = 0;
  for (uVar4 = 0; uVar4 < 3; uVar4 = uVar4 + 2) {
    paiVar7 = local_a0;
    for (uVar6 = 0; uVar6 != 2; uVar6 = uVar6 + 1) {
      uVar5 = uVar6 | uVar4 | 4;
      paiVar8 = paiVar7;
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        iVar3 = it->left_nz_[uVar5];
        iVar1 = local_98[lVar9];
        (*VP8SetResidualCoeffs)(*paiVar8,&local_60);
        iVar3 = (*VP8GetResidualCost)(iVar3 + iVar1,&local_60);
        local_a4 = local_a4 + iVar3;
        it->left_nz_[uVar5] = (uint)~local_60.last >> 0x1f;
        local_98[lVar9] = (uint)~local_60.last >> 0x1f;
        paiVar8 = paiVar8 + 1;
      }
      paiVar7 = paiVar7 + 2;
    }
    local_a0 = local_a0 + 4;
    local_98 = local_98 + 2;
  }
  return local_a4;
}

Assistant:

int VP8GetCostUV(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int ch, x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);  // re-import the non-zero context

  VP8InitResidual(0, 2, enc, &res);
  for (ch = 0; ch <= 2; ch += 2) {
    for (y = 0; y < 2; ++y) {
      for (x = 0; x < 2; ++x) {
        const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
        VP8SetResidualCoeffs(rd->uv_levels[ch * 2 + x + y * 2], &res);
        R += VP8GetResidualCost(ctx, &res);
        it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] = (res.last >= 0);
      }
    }
  }
  return R;
}